

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int base64_encode(char *in_bin,int in_len,char *out_base64,int out_len)

{
  byte *pbVar1;
  byte bVar2;
  uint codepos;
  int iVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  uint codepos_1;
  uint codepos_5;
  ulong uVar10;
  uint codepos_3;
  
  lVar6 = (long)in_len;
  pbVar1 = (byte *)(in_bin + lVar6);
  pcVar8 = out_base64 + out_len;
  iVar5 = 0;
  pcVar4 = out_base64;
  do {
    iVar3 = (int)out_base64;
    if ((lVar6 == 0) || (pcVar8 <= pcVar4)) {
      iVar3 = (int)pcVar4 - iVar3;
      pcVar8 = out_base64 + iVar3;
      pcVar9 = pcVar8 + (out_len - iVar3);
      pcVar4 = pcVar8;
LAB_00114bad:
      if (pcVar8 < pcVar9) {
        *pcVar8 = '\0';
      }
      iVar5 = (int)pcVar8 - (int)pcVar4;
LAB_00114bbb:
      return iVar3 + iVar5;
    }
    bVar2 = *in_bin;
    *pcVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2 >> 2];
    uVar10 = (ulong)((bVar2 & 3) << 4);
    if (((byte *)in_bin + 1 == pbVar1) || (pcVar8 <= pcVar4 + 1)) {
      iVar3 = (int)(pcVar4 + 1) - iVar3;
      if (out_len - iVar3 < 3) {
LAB_00114bb9:
        iVar5 = 0;
        goto LAB_00114bbb;
      }
      pcVar8 = out_base64 + iVar3;
      pcVar7 = pcVar8 + 2;
      pcVar4 = out_base64 + iVar3;
      pcVar9 = pcVar4 + (uint)(out_len - iVar3);
      *pcVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar10];
      pcVar8[1] = '=';
      lVar6 = 3;
LAB_00114ba6:
      pcVar8 = pcVar4 + lVar6;
      *pcVar7 = '=';
      goto LAB_00114bad;
    }
    bVar2 = ((byte *)in_bin)[1];
    pcVar4[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [bVar2 >> 4 | uVar10];
    uVar10 = (ulong)((bVar2 & 0xf) << 2);
    if (((byte *)in_bin + 2 == pbVar1) || (pcVar9 = pcVar4 + 4, pcVar8 <= pcVar9)) {
      iVar3 = ((int)pcVar4 + 2) - iVar3;
      if (out_len - iVar3 < 2) goto LAB_00114bb9;
      pcVar7 = out_base64 + iVar3 + 1;
      pcVar4 = out_base64 + iVar3;
      pcVar9 = pcVar4 + (uint)(out_len - iVar3);
      out_base64[iVar3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar10]
      ;
      lVar6 = 2;
      goto LAB_00114ba6;
    }
    bVar2 = ((byte *)in_bin)[2];
    pcVar4[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [bVar2 >> 6 | uVar10];
    pcVar4[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2 & 0x3f];
    iVar5 = iVar5 + 1;
    if (iVar5 == 0x12) {
      pcVar4[4] = '\n';
      pcVar9 = pcVar4 + 5;
      iVar5 = 0;
    }
    in_bin = (char *)((byte *)in_bin + 3);
    lVar6 = lVar6 + -3;
    pcVar4 = pcVar9;
  } while( true );
}

Assistant:

int
base64_encode(const char *in_bin, int in_len,
	      char *out_base64, int out_len)
{
	struct base64_encodestate state;
	base64_encodestate_init(&state);
	int res = base64_encode_block(in_bin, in_len, out_base64,
				      out_len, &state);
	return res + base64_encode_blockend(out_base64 + res, out_len - res,
					    &state);
}